

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O1

void compactor_change_threshold(filemgr *file,size_t new_threshold)

{
  avl_node *paVar1;
  openfiles_elem_conflict query;
  char acStack_548 [1296];
  avl_node local_38 [2];
  
  strcpy(acStack_548,file->filename);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  paVar1 = avl_search(&openfiles,local_38,_compactor_cmp);
  if (paVar1 != (avl_node *)0x0) {
    *(char *)((long)&paVar1[-10].right + 7) = (char)new_threshold;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
  return;
}

Assistant:

void compactor_change_threshold(struct filemgr *file, size_t new_threshold)
{
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;

    strcpy(query.filename, file->filename);
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        elem->config.compaction_threshold = new_threshold;
    }
    mutex_unlock(&cpt_lock);
}